

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
llvm::ItaniumPartialDemangler::~ItaniumPartialDemangler(ItaniumPartialDemangler *this)

{
  Db *this_00;
  ItaniumPartialDemangler *this_local;
  
  this_00 = (Db *)this->Context;
  if (this_00 != (Db *)0x0) {
    anon_unknown.dwarf_2f151d::Db::~Db(this_00);
    operator_delete(this_00,0x1300);
  }
  return;
}

Assistant:

ItaniumPartialDemangler::~ItaniumPartialDemangler() {
  delete static_cast<Db *>(Context);
}